

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O3

sat_solver * Pdr_ManNewSolver(sat_solver *pSat,Pdr_Man_t *p,int k,int fInit)

{
  int iVar1;
  Aig_Obj_t *pObj;
  int *piVar2;
  Pdr_Par_t *pPVar3;
  int iVar4;
  uint uVar5;
  Cnf_Dat_t *pCVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  void **ppvVar9;
  int *piVar10;
  long lVar11;
  Aig_Man_t *pAVar12;
  long lVar13;
  int iVar14;
  
  if (pSat == (sat_solver *)0x0) {
    __assert_fail("pSat != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                  ,0x1b9,"sat_solver *Pdr_ManNewSolver(sat_solver *, Pdr_Man_t *, int, int)");
  }
  if (p->pPars->fMonoCnf != 0) {
    pCVar6 = p->pCnf1;
    if (pCVar6 == (Cnf_Dat_t *)0x0) {
      pAVar12 = p->pAig;
      iVar14 = pAVar12->nRegs;
      iVar1 = pAVar12->nObjs[3];
      pAVar12->nRegs = iVar1;
      pCVar6 = Cnf_DeriveWithMan(p->pCnfMan,pAVar12,iVar1);
      p->pCnf1 = pCVar6;
      pAVar12 = p->pAig;
      pAVar12->nRegs = iVar14;
      if (p->vVar2Reg != (Vec_Int_t *)0x0) {
        __assert_fail("p->vVar2Reg == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                      ,0x16e,"sat_solver *Pdr_ManNewSolver1(sat_solver *, Pdr_Man_t *, int, int)");
      }
      iVar1 = pCVar6->nVars;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      iVar4 = 0x10;
      if (0xe < iVar1 - 1U) {
        iVar4 = iVar1;
      }
      pVVar7->nCap = iVar4;
      if (iVar4 == 0) {
        pVVar7->pArray = (int *)0x0;
        pVVar7->nSize = iVar1;
      }
      else {
        piVar8 = (int *)malloc((long)iVar4 << 2);
        pVVar7->pArray = piVar8;
        pVVar7->nSize = iVar1;
        if (piVar8 != (int *)0x0) {
          memset(piVar8,0xff,(long)iVar1 << 2);
        }
      }
      p->vVar2Reg = pVVar7;
      if (0 < iVar14) {
        iVar14 = 0;
        do {
          uVar5 = pAVar12->nTruePos + iVar14;
          if (((int)uVar5 < 0) || (pAVar12->vCos->nSize <= (int)uVar5)) goto LAB_008ce894;
          pObj = (Aig_Obj_t *)pAVar12->vCos->pArray[uVar5];
          pVVar7 = p->vVar2Reg;
          if (p->pPars->fMonoCnf == 0) {
            uVar5 = Pdr_ObjSatVar2(p,k,pObj,0,3);
          }
          else {
            uVar5 = p->pCnf1->pVarNums[pObj->Id];
          }
          if (((int)uVar5 < 0) || (pVVar7->nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar7->pArray[uVar5] = iVar14;
          iVar14 = iVar14 + 1;
          pAVar12 = p->pAig;
        } while (iVar14 < pAVar12->nRegs);
        pCVar6 = p->pCnf1;
      }
    }
    pSat = (sat_solver *)Cnf_DataWriteIntoSolverInt(pSat,pCVar6,1,fInit);
    goto LAB_008ce856;
  }
  if (p->pCnf2 == (Cnf_Dat_t *)0x0) {
    pCVar6 = Cnf_DeriveOtherWithMan(p->pCnfMan,p->pAig,0);
    p->pCnf2 = pCVar6;
    pVVar7 = (Vec_Int_t *)calloc((long)p->pAig->vObjs->nSize,0x10);
    p->pvId2Vars = pVVar7;
    if ((p->vVar2Ids).nCap < 0x100) {
      ppvVar9 = (p->vVar2Ids).pArray;
      if (ppvVar9 == (void **)0x0) {
        ppvVar9 = (void **)malloc(0x800);
      }
      else {
        ppvVar9 = (void **)realloc(ppvVar9,0x800);
      }
      (p->vVar2Ids).pArray = ppvVar9;
      (p->vVar2Ids).nCap = 0x100;
    }
  }
  iVar14 = (p->vVar2Ids).nSize;
  if (iVar14 <= k) {
    iVar1 = k + 1;
    iVar4 = (p->vVar2Ids).nCap;
    if (k < iVar4 * 2) {
      if (iVar4 <= k) {
        ppvVar9 = (p->vVar2Ids).pArray;
        if (ppvVar9 == (void **)0x0) {
          ppvVar9 = (void **)malloc((long)iVar4 << 4);
        }
        else {
          ppvVar9 = (void **)realloc(ppvVar9,(long)iVar4 << 4);
        }
        (p->vVar2Ids).pArray = ppvVar9;
        iVar14 = iVar4 * 2;
LAB_008ce75a:
        (p->vVar2Ids).nCap = iVar14;
        iVar14 = (p->vVar2Ids).nSize;
      }
    }
    else if (iVar4 <= k) {
      ppvVar9 = (p->vVar2Ids).pArray;
      if (ppvVar9 == (void **)0x0) {
        ppvVar9 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar9 = (void **)realloc(ppvVar9,(long)iVar1 << 3);
      }
      (p->vVar2Ids).pArray = ppvVar9;
      iVar14 = iVar1;
      goto LAB_008ce75a;
    }
    if (iVar14 <= k) {
      lVar11 = (long)iVar14;
      do {
        (p->vVar2Ids).pArray[lVar11] = (void *)0x0;
        lVar11 = lVar11 + 1;
      } while (iVar1 != lVar11);
    }
    (p->vVar2Ids).nSize = iVar1;
    iVar14 = iVar1;
  }
  if ((k < 0) || (iVar14 <= k)) {
LAB_008ce894:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar9 = (p->vVar2Ids).pArray;
  pVVar7 = (Vec_Int_t *)ppvVar9[(uint)k];
  if (pVVar7 == (Vec_Int_t *)0x0) {
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    piVar8 = &pVVar7->nSize;
    pVVar7->nCap = 500;
    pVVar7->nSize = 0;
    piVar10 = (int *)malloc(2000);
    pVVar7->pArray = piVar10;
    ppvVar9[(uint)k] = pVVar7;
  }
  else {
    piVar8 = &pVVar7->nSize;
    iVar14 = pVVar7->nSize;
    if (0 < iVar14) {
      piVar10 = pVVar7->pArray;
      lVar11 = 0;
      do {
        lVar13 = (long)piVar10[lVar11];
        if (lVar13 != -1) {
          if (p->pvId2Vars[lVar13].nSize <= k) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar2 = p->pvId2Vars[lVar13].pArray;
          if (piVar2[(uint)k] < 1) {
            __assert_fail("Vec_IntEntry( p->pvId2Vars + Entry, k ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                          ,0x19e,
                          "sat_solver *Pdr_ManNewSolver2(sat_solver *, Pdr_Man_t *, int, int)");
          }
          piVar2[(uint)k] = 0;
          iVar14 = *piVar8;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar14);
    }
  }
  *piVar8 = 0;
  Vec_IntPush(pVVar7,-1);
  sat_solver_setnvars(pSat,500);
LAB_008ce856:
  pSat->nRuntimeLimit = p->timeToStop;
  pPVar3 = p->pPars;
  pSat->RunId = pPVar3->RunId;
  pSat->pFuncStop = pPVar3->pFuncStop;
  return pSat;
}

Assistant:

sat_solver * Pdr_ManNewSolver( sat_solver * pSat, Pdr_Man_t * p, int k, int fInit )
{
    assert( pSat != NULL );
    if ( p->pPars->fMonoCnf )
        return Pdr_ManNewSolver1( pSat, p, k, fInit );
    else
        return Pdr_ManNewSolver2( pSat, p, k, fInit );
}